

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldState.cpp
# Opt level: O2

void __thiscall AI::WorldState::popChanges(WorldState *this)

{
  mapped_type_conflict mVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  mapped_type_conflict *pmVar5;
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  *this_00;
  value_type poppedChanges;
  StateChanges local_e0;
  
  StateChanges::StateChanges
            (&local_e0,
             (this->changes).super__Vector_base<AI::StateChanges,_std::allocator<AI::StateChanges>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::vector<AI::StateChanges,_std::allocator<AI::StateChanges>_>::pop_back(&this->changes);
  for (p_Var4 = local_e0.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != &local_e0.state.flags._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    mVar2 = (mapped_type)p_Var4[1].field_0x4;
    pmVar3 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)this,&p_Var4[1]._M_color);
    *pmVar3 = mVar2;
  }
  this_00 = &(this->current).values;
  for (p_Var4 = local_e0.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != &local_e0.state.values._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    mVar1 = *(mapped_type_conflict *)&p_Var4[1].field_0x4;
    pmVar5 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[](this_00,&p_Var4[1]._M_color);
    *pmVar5 = mVar1;
  }
  for (p_Var4 = local_e0.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_e0.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header
      ; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4[1].field_0x4 == '\x01') {
      std::
      map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
      ::operator[](this_00,&p_Var4[1]._M_color);
    }
    else {
      std::
      _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
      ::erase(&this_00->_M_t,&p_Var4[1]._M_color);
    }
  }
  StateChanges::~StateChanges(&local_e0);
  return;
}

Assistant:

void WorldState::popChanges()
	{
		auto poppedChanges = changes[changes.size() - 1];
		changes.pop_back();

		for (auto& flag : poppedChanges.state.flags)
		{
			current.flags[flag.first] = flag.second;
		}

		for (auto& value : poppedChanges.state.values)
		{
			current.values[value.first] = value.second;
		}

		for (auto& value : poppedChanges.valuesAddedOrRemoved)
		{
			if (value.second)
			{
				current.values[value.first];
			}
			else
			{
				current.values.erase(value.first);
			}
		}
	}